

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu_x86.c
# Opt level: O1

ND_UINT64 ShemuX86GetGprValue(SHEMU_CONTEXT *Context,ND_UINT32 Reg,ND_UINT32 Size,ND_BOOL High8)

{
  byte bVar1;
  ulong uVar2;
  ND_UINT64 NVar3;
  undefined3 in_register_00000009;
  
  uVar2 = (ulong)(Reg - 4);
  if (CONCAT31(in_register_00000009,High8) == 0) {
    uVar2 = (ulong)Reg;
  }
  if (Reg < 4) {
    uVar2 = (ulong)Reg;
  }
  bVar1 = (Context->Icache).Icache[uVar2 - 0x30];
  if ((bVar1 & 2) == 0) {
    (Context->Icache).Icache[uVar2 - 0x30] = bVar1 | 1;
  }
  if (Size == 4) {
    NVar3 = (ND_UINT64)*(uint *)((long)&Context->Arch + uVar2 * 8 + 0x1e8);
  }
  else if (Size == 2) {
    NVar3 = (ND_UINT64)*(ushort *)((long)&Context->Arch + uVar2 * 8 + 0x1e8);
  }
  else if (Size == 1) {
    uVar2 = *(ulong *)((long)&Context->Arch + uVar2 * 8 + 0x1e8);
    if (High8 == '\0') {
      NVar3 = uVar2 & 0xff;
    }
    else {
      NVar3 = uVar2 >> 8 & 0xff;
    }
  }
  else {
    NVar3 = *(ND_UINT64 *)((long)&Context->Arch + uVar2 * 8 + 0x1e8);
  }
  return NVar3;
}

Assistant:

static ND_UINT64
ShemuX86GetGprValue(
    SHEMU_CONTEXT *Context,
    ND_UINT32 Reg,
    ND_UINT32 Size,
    ND_BOOL High8
    )
{
    if (High8 && Reg >= 4)
    {
        Reg = Reg - 4;
    }

    // Any read of the GPR, before being modified, counts as being "saved". The reason here is that we cannot
    // easily track a proper save in memory, as the register may be copied in another register, and only then
    // saved.
    if (!(Context->Arch.X86.GprTracker[Reg] & GPR_TRACK_DIRTY))
    {
        Context->Arch.X86.GprTracker[Reg] |= GPR_TRACK_READ;
    }

    switch (Size)
    {
    case 1:
        if (High8)
        {
            // AH, CH, DH or BH accessed.
            return (*(&Context->Arch.X86.Registers.RegRax + Reg) >> 8) & 0xff;
        }
        else
        {
            return *(&Context->Arch.X86.Registers.RegRax + Reg) & 0xff;
        }

    case 2:
        return *(&Context->Arch.X86.Registers.RegRax + Reg) & 0xffff;

    case 4:
        return *(&Context->Arch.X86.Registers.RegRax + Reg) & 0xffffffff;

    default:
        return *(&Context->Arch.X86.Registers.RegRax + Reg);
    }
}